

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSLoader.cpp
# Opt level: O3

void __thiscall Assimp::Discreet3DSImporter::ParseObjectChunk(Discreet3DSImporter *this)

{
  ai_real aVar1;
  StreamReader<false,_false> *this_00;
  char *name;
  int8_t *piVar2;
  Scene *this_01;
  char cVar3;
  _IEEESingle temp;
  uint uVar4;
  Logger *this_02;
  long *plVar5;
  size_type *psVar6;
  uint uVar7;
  float fVar8;
  Chunk chunk;
  Chunk local_4b6;
  string local_4b0;
  string *local_490;
  aiColor3D *local_488;
  undefined1 *local_480 [2];
  undefined1 local_470 [16];
  ostringstream local_460 [112];
  ios_base local_3f0 [264];
  Material local_2e8;
  
  if (5 < (uint)(*(int *)&this->stream->limit - *(int *)&this->stream->current)) {
    local_490 = (string *)&this->mBackgroundImage;
    local_488 = &this->mClrAmbient;
    do {
      ReadChunk(this,&local_4b6);
      if ((int)(local_4b6.Size - 6) < 1) {
        uVar4 = (int)this->stream->limit - (int)this->stream->current;
      }
      else {
        this_00 = this->stream;
        uVar4 = StreamReader<false,_false>::SetReadLimit
                          (this_00,(local_4b6.Size - 6) +
                                   (*(int *)&this_00->current - *(int *)&this_00->buffer));
        if (local_4b6.Flag < 0x2100) {
          if (local_4b6.Flag == 0x100) {
            fVar8 = StreamReader<false,_false>::Get<float>(this->stream);
            this->mMasterScale = fVar8;
          }
          else if (local_4b6.Flag == 0x1100) {
            piVar2 = this->stream->current;
            uVar7 = 0xffffffff;
            do {
              cVar3 = StreamReader<false,_false>::Get<signed_char>(this->stream);
              uVar7 = uVar7 + 1;
            } while (cVar3 != '\0');
            psVar6 = &local_2e8.mName._M_string_length;
            local_2e8._vptr_Material = (_func_int **)psVar6;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_2e8,piVar2,piVar2 + uVar7);
            std::__cxx11::string::operator=(local_490,(string *)&local_2e8);
            if (local_2e8._vptr_Material != (_func_int **)psVar6) {
              operator_delete(local_2e8._vptr_Material);
            }
          }
          else if (local_4b6.Flag == 0x1101) {
            this->bHasBG = true;
          }
        }
        else if (local_4b6.Flag == 0x2100) {
          ParseColorChunk(this,local_488,true);
          aVar1 = (this->mClrAmbient).r;
          if (((uint)aVar1 & 0x7fffff) != 0 && (~(uint)aVar1 & 0x7f800000) == 0) {
            this_02 = DefaultLogger::get();
            Logger::error(this_02,"3DS: Failed to read ambient base color");
            (this->mClrAmbient).b = 0.0;
            (this->mClrAmbient).r = 0.0;
            (this->mClrAmbient).g = 0.0;
          }
        }
        else if (local_4b6.Flag == 0xafff) {
          this_01 = this->mScene;
          std::__cxx11::ostringstream::ostringstream(local_460);
          std::ostream::_M_insert<unsigned_long>((ulong)local_460);
          std::__cxx11::stringbuf::str();
          std::__cxx11::ostringstream::~ostringstream(local_460);
          std::ios_base::~ios_base(local_3f0);
          plVar5 = (long *)std::__cxx11::string::replace((ulong)local_480,0,(char *)0x0,0x757fd7);
          local_4b0._M_dataplus._M_p = (pointer)&local_4b0.field_2;
          psVar6 = (size_type *)(plVar5 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar5 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar6) {
            local_4b0.field_2._M_allocated_capacity = *psVar6;
            local_4b0.field_2._8_8_ = plVar5[3];
          }
          else {
            local_4b0.field_2._M_allocated_capacity = *psVar6;
            local_4b0._M_dataplus._M_p = (pointer)*plVar5;
          }
          local_4b0._M_string_length = plVar5[1];
          *plVar5 = (long)psVar6;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          D3DS::Material::Material(&local_2e8,&local_4b0);
          std::vector<Assimp::D3DS::Material,_std::allocator<Assimp::D3DS::Material>_>::
          emplace_back<Assimp::D3DS::Material>(&this_01->mMaterials,&local_2e8);
          D3DS::Material::~Material(&local_2e8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
            operator_delete(local_4b0._M_dataplus._M_p);
          }
          if (local_480[0] != local_470) {
            operator_delete(local_480[0]);
          }
          ParseMaterialChunk(this);
        }
        else if (local_4b6.Flag == 0x4000) {
          name = this->stream->current;
          uVar7 = 0xffffffff;
          do {
            cVar3 = StreamReader<false,_false>::Get<signed_char>(this->stream);
            uVar7 = uVar7 + 1;
          } while (cVar3 != '\0');
          ParseChunk(this,name,uVar7);
        }
        this->stream->current = this->stream->limit;
        StreamReader<false,_false>::SetReadLimit(this->stream,uVar4);
        uVar4 = (int)this->stream->limit - (int)this->stream->current;
        if (uVar4 == 0) {
          return;
        }
      }
    } while (5 < uVar4);
  }
  return;
}

Assistant:

void Discreet3DSImporter::ParseObjectChunk()
{
    ASSIMP_3DS_BEGIN_CHUNK();

    // get chunk type
    switch (chunk.Flag)
    {
    case Discreet3DS::CHUNK_OBJBLOCK:
        {
        unsigned int cnt = 0;
        const char* sz = (const char*)stream->GetPtr();

        // Get the name of the geometry object
        while (stream->GetI1())++cnt;
        ParseChunk(sz,cnt);
        }
        break;

    case Discreet3DS::CHUNK_MAT_MATERIAL:

        // Add a new material to the list
        mScene->mMaterials.push_back(D3DS::Material(std::string("UNNAMED_" + to_string(mScene->mMaterials.size()))));
        ParseMaterialChunk();
        break;

    case Discreet3DS::CHUNK_AMBCOLOR:

        // This is the ambient base color of the scene.
        // We add it to the ambient color of all materials
        ParseColorChunk(&mClrAmbient,true);
        if (is_qnan(mClrAmbient.r))
        {
            // We failed to read the ambient base color.
            ASSIMP_LOG_ERROR("3DS: Failed to read ambient base color");
            mClrAmbient.r = mClrAmbient.g = mClrAmbient.b = 0.0f;
        }
        break;

    case Discreet3DS::CHUNK_BIT_MAP:
        {
        // Specifies the background image. The string should already be
        // properly 0 terminated but we need to be sure
        unsigned int cnt = 0;
        const char* sz = (const char*)stream->GetPtr();
        while (stream->GetI1())++cnt;
        mBackgroundImage = std::string(sz,cnt);
        }
        break;

    case Discreet3DS::CHUNK_BIT_MAP_EXISTS:
        bHasBG = true;
        break;

    case Discreet3DS::CHUNK_MASTER_SCALE:
        // Scene master scaling factor
        mMasterScale = stream->GetF4();
        break;
    };
    ASSIMP_3DS_END_CHUNK();
}